

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cc
# Opt level: O1

void __thiscall re2c::RuleOp::display(RuleOp *this,ostream *o)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<void_const*>(o);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/",1);
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,";",1);
  return;
}

Assistant:

void RuleOp::display (std::ostream & o) const
{
	o << exp << "/" << ctx << ";";
}